

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int64_t JS_FlattenIntoArray(JSContext *ctx,JSValue target,JSValue source,int64_t sourceLen,
                           int64_t targetIndex,int depth,JSValue mapperFunction,JSValue thisArg)

{
  JSValue mapperFunction_00;
  JSValue thisArg_00;
  JSValue v;
  JSValue v_00;
  JSValue func_obj;
  JSValue this_obj;
  int iVar1;
  uintptr_t sp;
  JSValueUnion idx;
  int64_t iVar2;
  JSValueUnion JVar3;
  JSValue target_00;
  JSValue this_obj_00;
  JSValue v_01;
  JSValue JVar4;
  uint uStack_f4;
  uint uStack_e4;
  JSValueUnion local_d8;
  int64_t iStack_d0;
  JSValueUnion local_c8;
  ulong local_c0;
  JSValueUnion local_b8;
  int64_t local_b0;
  int64_t local_a0;
  int64_t elementLen;
  JSValueUnion local_90;
  int64_t local_88;
  JSValueUnion local_80;
  int64_t local_78;
  int64_t local_70;
  JSValueUnion local_68;
  int64_t local_60;
  JSValueUnion local_58;
  JSValueUnion local_50;
  int local_44;
  JSValueUnion local_40;
  int64_t iStack_38;
  
  local_70 = source.tag;
  local_68 = source.u;
  local_60 = target.tag;
  local_58 = target.u;
  if (&stack0xfffffffffffffff8 < (undefined1 *)ctx->rt->stack_limit) {
    JS_ThrowStackOverflow(ctx);
LAB_001562fa:
    targetIndex = -1;
  }
  else {
    local_90 = mapperFunction.u;
    local_88 = mapperFunction.tag;
    elementLen = mapperFunction.tag & 0xffffffff;
    local_80 = thisArg.u;
    local_78 = thisArg.tag;
    local_44 = depth + -1;
    idx.float64 = 0.0;
    local_50 = (JSValueUnion)sourceLen;
    if (sourceLen < 1) {
      sourceLen = (int64_t)idx.float64;
      local_50.float64 = idx.float64;
    }
    for (; (void *)sourceLen != idx.ptr; idx.float64 = idx.float64 + 1) {
      JVar4.tag = local_70;
      JVar4.u.float64 = local_68.float64;
      iVar1 = JS_TryGetPropertyInt64(ctx,JVar4,(int64_t)idx,(JSValue *)&local_40);
      if (iVar1 < 0) goto LAB_001562fa;
      if (iVar1 != 0) {
        if ((int)elementLen != 3) {
          local_d8 = local_40;
          iStack_d0 = iStack_38;
          local_c0 = (ulong)idx.ptr >> 0x1f;
          local_c8.float64 = (double)idx.float64;
          if (local_c0 == 0) {
            local_c8 = idx;
          }
          if (local_c0 != 0) {
            local_c0 = 7;
          }
          local_b8.float64 = local_68.float64;
          local_b0 = local_70;
          func_obj.tag = local_88;
          func_obj.u.float64 = local_90.float64;
          this_obj.tag = local_78;
          this_obj.u.float64 = local_80.float64;
          JVar4 = JS_Call(ctx,func_obj,this_obj,3,(JSValue *)&local_d8);
          v.tag = iStack_d0;
          v.u.float64 = local_d8.float64;
          _local_40 = JVar4;
          JS_FreeValue(ctx,v);
          v_00.tag = local_c0;
          v_00.u.float64 = local_c8.float64;
          JS_FreeValue(ctx,v_00);
          if ((int)JVar4.tag == 6) goto LAB_001562fa;
        }
        JVar4 = _local_40;
        if (depth < 1) {
LAB_0015628a:
          if (targetIndex < 0x1fffffffffffff) {
            this_obj_00.tag = local_60;
            this_obj_00.u.ptr = local_58.ptr;
            iVar1 = JS_DefinePropertyValueInt64(ctx,this_obj_00,targetIndex,_local_40,0x4007);
            if (-1 < iVar1) {
              targetIndex = targetIndex + 1;
              sourceLen = (int64_t)local_50;
              goto LAB_001562c6;
            }
            goto LAB_001562fa;
          }
          JS_ThrowTypeError(ctx,"Array too long");
          iVar2 = iStack_38;
          JVar3 = local_40;
        }
        else {
          JVar3 = local_40;
          iVar2 = iStack_38;
          iVar1 = JS_IsArray(ctx,_local_40);
          if (-1 < iVar1) {
            if (iVar1 == 0) goto LAB_0015628a;
            iVar1 = js_get_length64(ctx,&local_a0,JVar4);
            if ((-1 < iVar1) &&
               (mapperFunction_00.tag = 3,
               mapperFunction_00.u.ptr = (void *)((ulong)uStack_f4 << 0x20), thisArg_00.tag = 3,
               thisArg_00.u.ptr = (void *)((ulong)uStack_e4 << 0x20), target_00.tag = local_60,
               target_00.u.ptr = local_58.ptr,
               targetIndex = JS_FlattenIntoArray(ctx,target_00,JVar4,local_a0,targetIndex,local_44,
                                                 mapperFunction_00,thisArg_00), -1 < targetIndex)) {
              JS_FreeValue(ctx,JVar4);
              sourceLen = (int64_t)local_50;
              goto LAB_001562c6;
            }
          }
        }
        v_01.tag = iVar2;
        v_01.u.float64 = JVar3.float64;
        JS_FreeValue(ctx,v_01);
        goto LAB_001562fa;
      }
LAB_001562c6:
    }
  }
  return targetIndex;
}

Assistant:

static int64_t JS_FlattenIntoArray(JSContext *ctx, JSValueConst target,
                                   JSValueConst source, int64_t sourceLen,
                                   int64_t targetIndex, int depth,
                                   JSValueConst mapperFunction,
                                   JSValueConst thisArg)
{
    JSValue element;
    int64_t sourceIndex, elementLen;
    int present, is_array;

    if (js_check_stack_overflow(ctx->rt, 0)) {
        JS_ThrowStackOverflow(ctx);
        return -1;
    }

    for (sourceIndex = 0; sourceIndex < sourceLen; sourceIndex++) {
        present = JS_TryGetPropertyInt64(ctx, source, sourceIndex, &element);
        if (present < 0)
            return -1;
        if (!present)
            continue;
        if (!JS_IsUndefined(mapperFunction)) {
            JSValueConst args[3] = { element, JS_NewInt64(ctx, sourceIndex), source };
            element = JS_Call(ctx, mapperFunction, thisArg, 3, args);
            JS_FreeValue(ctx, (JSValue)args[0]);
            JS_FreeValue(ctx, (JSValue)args[1]);
            if (JS_IsException(element))
                return -1;
        }
        if (depth > 0) {
            is_array = JS_IsArray(ctx, element);
            if (is_array < 0)
                goto fail;
            if (is_array) {
                if (js_get_length64(ctx, &elementLen, element) < 0)
                    goto fail;
                targetIndex = JS_FlattenIntoArray(ctx, target, element,
                                                  elementLen, targetIndex,
                                                  depth - 1,
                                                  JS_UNDEFINED, JS_UNDEFINED);
                if (targetIndex < 0)
                    goto fail;
                JS_FreeValue(ctx, element);
                continue;
            }
        }
        if (targetIndex >= MAX_SAFE_INTEGER) {
            JS_ThrowTypeError(ctx, "Array too long");
            goto fail;
        }
        if (JS_DefinePropertyValueInt64(ctx, target, targetIndex, element,
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0)
            return -1;
        targetIndex++;
    }
    return targetIndex;

fail:
    JS_FreeValue(ctx, element);
    return -1;
}